

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

void stbir__calculate_filters
               (stbir__contributors *contributors,float *coefficients,stbir_filter filter,
               float scale_ratio,float shift,int input_size,int output_size)

{
  float *pfVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int out_last_pixel;
  int out_first_pixel;
  float out_center_of_in;
  float *local_68;
  float *local_60;
  int local_58;
  float local_54;
  ulong local_50;
  ulong local_48;
  int local_3c;
  stbir__support_fn *local_38;
  
  local_58 = output_size;
  local_54 = shift;
  local_3c = input_size;
  uVar2 = stbir__get_contributors(scale_ratio,filter,input_size,output_size);
  local_38 = stbir__filter_info_table[filter].support;
  local_60 = coefficients;
  if (1.0 < scale_ratio) {
    fVar16 = 1.0 / scale_ratio;
    fVar14 = (*local_38)(fVar16);
    uVar11 = 0;
    local_48 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      local_48 = uVar11;
    }
    for (; uVar11 != local_48; uVar11 = uVar11 + 1) {
      iVar6 = (int)uVar11;
      stbir__calculate_sample_range_upsample
                (iVar6,fVar14 * scale_ratio,scale_ratio,local_54,&out_first_pixel,&out_last_pixel,
                 &out_center_of_in);
      fVar15 = out_center_of_in;
      iVar5 = out_first_pixel;
      iVar3 = out_last_pixel;
      iVar4 = stbir__get_coefficient_width(filter,scale_ratio);
      fVar17 = (*local_38)(fVar16);
      fVar17 = ceilf(fVar17 + fVar17);
      if ((int)fVar17 < iVar3 - iVar5) {
        __assert_fail("in_last_pixel - in_first_pixel <= (int)ceil(stbir__filter_info_table[filter].support(1/scale) * 2)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x414,
                      "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                     );
      }
      contributors[uVar11].n0 = iVar5;
      contributors[uVar11].n1 = iVar3;
      local_68 = (float *)CONCAT44(local_68._4_4_,iVar3);
      if (iVar3 < iVar5) {
        __assert_fail("contributor->n1 >= contributor->n0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x419,
                      "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                     );
      }
      iVar3 = 0;
      fVar17 = 0.0;
LAB_0012f8f0:
      uVar2 = (int)local_68 - iVar5;
      local_50 = CONCAT44(local_50._4_4_,fVar17);
      while (iVar3 <= (int)uVar2) {
        fVar17 = (*stbir__filter_info_table[filter].kernel)
                           (fVar15 - ((float)(iVar5 + iVar3) + 0.5),fVar16);
        coefficients[(long)(iVar4 * iVar6) + (long)iVar3] = fVar17;
        if (((iVar3 != 0) || (fVar17 != 0.0)) || (NAN(fVar17))) goto LAB_0012f958;
        iVar5 = iVar5 + 1;
        contributors[uVar11].n0 = iVar5;
        uVar2 = uVar2 - 1;
        iVar3 = 0;
      }
      fVar15 = (*stbir__filter_info_table[filter].kernel)
                         (((float)((int)local_68 + 1) + 0.5) - fVar15,fVar16);
      if ((fVar15 != 0.0) || (NAN(fVar15))) {
        __assert_fail("stbir__filter_info_table[filter].kernel((float)(in_last_pixel + 1) + 0.5f - in_center_of_out, 1/scale) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x42b,
                      "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                     );
      }
      if ((float)local_50 <= 0.9) {
        __assert_fail("total_filter > 0.9",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x42d,
                      "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                     );
      }
      if (1.1 <= (float)local_50) {
        __assert_fail("total_filter < 1.1f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x42e,
                      "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                     );
      }
      lVar10 = (long)(int)uVar2;
      if ((long)(int)uVar2 < 0) {
        lVar10 = -1;
      }
      for (lVar8 = 0; lVar10 + 1 != lVar8; lVar8 = lVar8 + 1) {
        local_60[iVar4 * iVar6 + lVar8] = local_60[iVar4 * iVar6 + lVar8] * (1.0 / (float)local_50);
      }
      while (((-1 < (int)uVar2 && (coefficients[(long)(iVar4 * iVar6) + (ulong)uVar2] == 0.0)) &&
             (!NAN(coefficients[(long)(iVar4 * iVar6) + (ulong)uVar2])))) {
        iVar3 = contributors[uVar11].n0 + uVar2;
        uVar2 = uVar2 - 1;
        contributors[uVar11].n1 = iVar3 + -1;
      }
      coefficients = local_60;
    }
  }
  else {
    fVar14 = (*local_38)(scale_ratio);
    uVar11 = 0;
    local_48 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      local_48 = uVar11;
    }
    while (iVar3 = local_58, uVar11 != local_48) {
      iVar3 = stbir__get_filter_pixel_margin(filter,scale_ratio);
      iVar6 = (int)uVar11;
      stbir__calculate_sample_range_downsample
                (iVar6 - iVar3,fVar14 / scale_ratio,scale_ratio,local_54,&out_first_pixel,
                 &out_last_pixel,&out_center_of_in);
      fVar16 = out_center_of_in;
      iVar5 = out_first_pixel;
      iVar3 = out_last_pixel;
      iVar4 = stbir__get_coefficient_width(filter,scale_ratio);
      uVar2 = iVar3 - iVar5;
      fVar15 = (*local_38)(scale_ratio);
      fVar15 = ceilf(fVar15 + fVar15);
      if ((int)fVar15 < (int)uVar2) {
        __assert_fail("out_last_pixel - out_first_pixel <= (int)ceil(stbir__filter_info_table[filter].support(scale_ratio) * 2)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x444,
                      "void stbir__calculate_coefficients_downsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                     );
      }
      contributors[uVar11].n0 = iVar5;
      contributors[uVar11].n1 = iVar3;
      if (iVar3 < iVar5) {
        __assert_fail("contributor->n1 >= contributor->n0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x449,
                      "void stbir__calculate_coefficients_downsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                     );
      }
      local_68 = coefficients + iVar4 * iVar6;
      local_50 = uVar11;
      for (lVar10 = 0; lVar10 <= (int)uVar2; lVar10 = lVar10 + 1) {
        fVar15 = (*stbir__filter_info_table[filter].kernel)
                           (((float)(iVar5 + (int)lVar10) + 0.5) - fVar16,scale_ratio);
        coefficients[iVar6 * iVar4 + lVar10] = fVar15 * scale_ratio;
      }
      fVar16 = (*stbir__filter_info_table[filter].kernel)
                         (((float)(iVar3 + 1) + 0.5) - fVar16,scale_ratio);
      if ((fVar16 != 0.0) || (NAN(fVar16))) {
        __assert_fail("stbir__filter_info_table[filter].kernel((float)(out_last_pixel + 1) + 0.5f - out_center_of_in, scale_ratio) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x452,
                      "void stbir__calculate_coefficients_downsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                     );
      }
      while (((-1 < (int)uVar2 && (local_68[uVar2] == 0.0)) && (!NAN(local_68[uVar2])))) {
        iVar3 = contributors[local_50].n0 + uVar2;
        uVar2 = uVar2 - 1;
        contributors[local_50].n1 = iVar3 + -1;
      }
      coefficients = local_60;
      uVar11 = local_50 + 1;
    }
    uVar2 = stbir__get_contributors(scale_ratio,filter,local_3c,local_58);
    iVar5 = stbir__get_coefficient_width(filter,scale_ratio);
    uVar12 = 0;
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar11 = uVar12;
    }
    iVar4 = 0;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    local_68 = (float *)CONCAT44(local_68._4_4_,iVar5);
    while (iVar3 = (int)uVar12, iVar3 != iVar4) {
      fVar14 = 0.0;
      for (uVar12 = 0; (uVar11 != uVar12 && (iVar5 = contributors[uVar12].n0, iVar5 <= iVar3));
          uVar12 = uVar12 + 1) {
        if (iVar3 <= contributors[uVar12].n1) {
          iVar6 = stbir__get_coefficient_width(filter,scale_ratio);
          fVar14 = fVar14 + coefficients[(iVar3 - iVar5) + (int)uVar12 * iVar6];
        }
      }
      if (fVar14 <= 0.9) {
        __assert_fail("total > 0.9f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x475,
                      "void stbir__normalize_downsample_coefficients(stbir__contributors *, float *, stbir_filter, float, int, int)"
                     );
      }
      if (1.1 <= fVar14) {
        __assert_fail("total < 1.1f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x476,
                      "void stbir__normalize_downsample_coefficients(stbir__contributors *, float *, stbir_filter, float, int, int)"
                     );
      }
      for (uVar12 = 0; (uVar11 != uVar12 && (iVar5 = contributors[uVar12].n0, iVar5 <= iVar3));
          uVar12 = uVar12 + 1) {
        if (iVar3 <= contributors[uVar12].n1) {
          iVar6 = stbir__get_coefficient_width(filter,scale_ratio);
          iVar5 = (iVar3 - iVar5) + (int)uVar12 * iVar6;
          coefficients[iVar5] = coefficients[iVar5] * (1.0 / fVar14);
        }
      }
      uVar12 = (ulong)(iVar3 + 1);
    }
    for (uVar12 = 0; pfVar1 = local_60, uVar12 != uVar11; uVar12 = uVar12 + 1) {
      iVar4 = -1;
      iVar3 = 0;
      iVar5 = 1;
      do {
        iVar13 = iVar5;
        iVar6 = iVar3;
        iVar3 = stbir__get_coefficient_width(filter,scale_ratio);
        iVar9 = (int)uVar12;
        iVar7 = iVar3 * iVar9 + iVar4;
        iVar4 = iVar4 + 1;
        iVar3 = iVar6 + -1;
        iVar5 = iVar13 + 1;
      } while (pfVar1[iVar7 + 1] == 0.0);
      iVar3 = contributors[uVar12].n0;
      contributors[uVar12].n0 = iVar4 + iVar3;
      iVar6 = -iVar6;
      for (iVar13 = iVar13 + iVar3; iVar13 + -1 < 0; iVar13 = iVar13 + 1) {
        contributors[uVar12].n0 = iVar13;
        iVar6 = iVar6 + 1;
      }
      iVar3 = (contributors[uVar12].n1 - iVar13) + 2;
      if ((int)local_68 < iVar3) {
        iVar3 = (int)local_68;
      }
      iVar5 = stbir__get_coefficient_width(filter,scale_ratio);
      iVar4 = 0;
      for (; (iVar4 < iVar3 && (iVar6 < iVar5)); iVar6 = iVar6 + 1) {
        iVar7 = stbir__get_coefficient_width(filter,scale_ratio);
        pfVar1 = local_60;
        fVar14 = local_60[iVar7 * iVar9 + iVar6];
        iVar7 = stbir__get_coefficient_width(filter,scale_ratio);
        pfVar1[iVar7 * iVar9 + iVar4] = fVar14;
        iVar4 = iVar4 + 1;
      }
    }
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      iVar3 = contributors[uVar12].n1;
      if (local_58 + -1 <= contributors[uVar12].n1) {
        iVar3 = local_58 + -1;
      }
      contributors[uVar12].n1 = iVar3;
    }
  }
  return;
LAB_0012f958:
  fVar17 = (float)local_50 + fVar17;
  iVar3 = iVar3 + 1;
  goto LAB_0012f8f0;
}

Assistant:

static void stbir__calculate_filters(stbir__contributors* contributors, float* coefficients, stbir_filter filter, float scale_ratio, float shift, int input_size, int output_size)
{
    int n;
    int total_contributors = stbir__get_contributors(scale_ratio, filter, input_size, output_size);

    if (stbir__use_upsampling(scale_ratio))
    {
        float out_pixels_radius = stbir__filter_info_table[filter].support(1 / scale_ratio) * scale_ratio;

        // Looping through out pixels
        for (n = 0; n < total_contributors; n++)
        {
            float in_center_of_out; // Center of the current out pixel in the in pixel space
            int in_first_pixel, in_last_pixel;

            stbir__calculate_sample_range_upsample(n, out_pixels_radius, scale_ratio, shift, &in_first_pixel, &in_last_pixel, &in_center_of_out);

            stbir__calculate_coefficients_upsample(filter, scale_ratio, in_first_pixel, in_last_pixel, in_center_of_out, stbir__get_contributor(contributors, n), stbir__get_coefficient(coefficients, filter, scale_ratio, n, 0));
        }
    }
    else
    {
        float in_pixels_radius = stbir__filter_info_table[filter].support(scale_ratio) / scale_ratio;

        // Looping through in pixels
        for (n = 0; n < total_contributors; n++)
        {
            float out_center_of_in; // Center of the current out pixel in the in pixel space
            int out_first_pixel, out_last_pixel;
            int n_adjusted = n - stbir__get_filter_pixel_margin(filter, scale_ratio);

            stbir__calculate_sample_range_downsample(n_adjusted, in_pixels_radius, scale_ratio, shift, &out_first_pixel, &out_last_pixel, &out_center_of_in);

            stbir__calculate_coefficients_downsample(filter, scale_ratio, out_first_pixel, out_last_pixel, out_center_of_in, stbir__get_contributor(contributors, n), stbir__get_coefficient(coefficients, filter, scale_ratio, n, 0));
        }

        stbir__normalize_downsample_coefficients(contributors, coefficients, filter, scale_ratio, input_size, output_size);
    }
}